

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testCompositeDeepScanLine.cpp
# Opt level: O2

data<float> * __thiscall
anon_unknown.dwarf_6bac9::data<float>::operator<<(data<float> *this,end *param_1)

{
  long lVar1;
  ArgExc *this_00;
  
  lVar1 = (long)(this->_channels).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->_channels).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start >> 5;
  if (this->_inserting_result == true) {
    if ((long)(this->_current_result).super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(this->_current_result).super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start >> 2 != lVar1) {
      this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
      Iex_3_2::ArgExc::ArgExc
                (this_00,"bug in test suite: cannot end result: wrong number of values written");
LAB_00131984:
      __cxa_throw(this_00,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
    }
    std::
    vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ::push_back(&this->_results,&this->_current_result);
    std::vector<float,_std::allocator<float>_>::resize(&this->_current_result,0);
    std::
    vector<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
    ::push_back(&this->_samples,&this->_current_pixel);
    std::
    vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ::resize(&this->_current_pixel,0);
    this->_inserting_result = false;
  }
  else {
    if ((long)(this->_current_sample).super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(this->_current_sample).super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start >> 2 != lVar1) {
      this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
      Iex_3_2::ArgExc::ArgExc
                (this_00,"bug in test suite: cannot end sample: wrong number of values written");
      goto LAB_00131984;
    }
    std::
    vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ::push_back(&this->_current_pixel,&this->_current_sample);
    std::vector<float,_std::allocator<float>_>::resize(&this->_current_sample,0);
  }
  return this;
}

Assistant:

data& operator<< (const end&)
    {
        if (_inserting_result)
        {
            if (_current_result.size () != _channels.size ())
            {
                throw IEX_NAMESPACE::ArgExc (
                    "bug in test suite: cannot end result: wrong number of values written");
            }
            _results.push_back (_current_result);
            _current_result.resize (0);

            //
            // also cause the current_samples to be written as the given number of pixels
            //
            _samples.push_back (_current_pixel);
            _current_pixel.resize (0);
            _inserting_result = false;
        }
        else
        {
            if (_current_sample.size () != _channels.size ())
            {
                throw IEX_NAMESPACE::ArgExc (
                    "bug in test suite: cannot end sample: wrong number of values written");
            }
            _current_pixel.push_back (_current_sample);
            _current_sample.resize (0);
        }
        return *this;
    }